

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GLSL420Pack::QualifierOrderUniformTest::prepareNextTestCase
          (QualifierOrderUniformTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  bool bVar1;
  pointer pQVar2;
  GLchar *__s;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pvVar7;
  MessageBuilder message;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  uVar6 = (ulong)test_case_index;
  this->m_current_test_case_index = test_case_index;
  if (test_case_index == 0xffffffff) {
    pvVar7 = (this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
  }
  else {
    pvVar7 = (this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->m_test_cases).
                   super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
            -0x5555555555555555;
    if (uVar4 < test_case_index || uVar4 - test_case_index == 0) {
      return false;
    }
  }
  local_1a8._0_8_ =
       ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  pQVar2 = pvVar7[uVar6].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar7[uVar6].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) != pQVar2) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      __s = Utils::getQualifierString(pQVar2[uVar4]);
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      pQVar2 = pvVar7[uVar6].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar5 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar7[uVar6].
                                             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                                             ._M_impl.super__Vector_impl_data + 8) - (long)pQVar2 >>
                             2);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  return true;
}

Assistant:

bool QualifierOrderUniformTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		/* Nothing to be done here */;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	const Utils::qualifierSet& set = getCurrentTestCase();

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	for (GLuint i = 0; i < set.size(); ++i)
	{
		message << Utils::getQualifierString(set[i]) << " ";
	}

	message << tcu::TestLog::EndMessage;

	return true;
}